

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.cc
# Opt level: O3

void testing::internal::PrintWideCharsAsStringTo(wchar_t *begin,size_t len,ostream *os)

{
  wchar_t c;
  int iVar1;
  CharFormat CVar2;
  size_t sVar3;
  bool bVar4;
  
  std::__ostream_insert<char,std::char_traits<char>>(os,"L\"",2);
  if (len != 0) {
    bVar4 = false;
    sVar3 = 0;
    do {
      c = begin[sVar3];
      if ((bool)((uint)c < 0x80 & bVar4)) {
        iVar1 = isxdigit(c);
        if (iVar1 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(os,"\" L\"",4);
        }
      }
      CVar2 = PrintAsWideStringLiteralTo(c,os);
      bVar4 = CVar2 == kHexEscape;
      sVar3 = sVar3 + 1;
    } while (len != sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"\"",1);
  return;
}

Assistant:

static void PrintWideCharsAsStringTo(const wchar_t* begin, size_t len,
                                     ostream* os) {
  *os << "L\"";
  bool is_previous_hex = false;
  for (size_t index = 0; index < len; ++index) {
    const wchar_t cur = begin[index];
    if (is_previous_hex && isascii(cur) && IsXDigit(static_cast<char>(cur))) {
      // Previous character is of '\x..' form and this character can be
      // interpreted as another hexadecimal digit in its number. Break string to
      // disambiguate.
      *os << "\" L\"";
    }
    is_previous_hex = PrintAsWideStringLiteralTo(cur, os) == kHexEscape;
  }
  *os << "\"";
}